

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::
str<kj::String&,char_const(&)[9],int_const&,char,unsigned_int,char,kj::String_const&,char_const(&)[9]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [9],int *params_2
          ,char *params_3,uint *params_4,char *params_5,String *params_6,char (*params_7) [9])

{
  long lVar1;
  ArrayPtr<const_char> *params_7_00;
  undefined1 local_a2 [2];
  ArrayPtr<const_char> local_a0;
  long local_90;
  long local_88;
  ArrayPtr<const_char> local_80;
  long local_70;
  long local_68;
  CappedArray<char,_14UL> local_60;
  CappedArray<char,_14UL> local_48;
  
  lVar1 = *(long *)(this + 8);
  local_90 = lVar1;
  if (lVar1 != 0) {
    local_90 = *(long *)this;
  }
  local_88 = lVar1 + -1;
  if (lVar1 == 0) {
    local_88 = 0;
  }
  local_a0.size_ = strlen((char *)params);
  local_a0.ptr = (char *)params;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(int *)*params_1);
  local_a2[1] = (undefined1)*params_2;
  _::Stringifier::operator*(&local_60,(Stringifier *)&_::STR,*(uint *)params_3);
  local_a2[0] = (undefined1)*params_4;
  lVar1 = *(long *)(params_5 + 8);
  local_70 = lVar1;
  if (lVar1 != 0) {
    local_70 = *(long *)params_5;
  }
  local_68 = lVar1 + -1;
  if (lVar1 == 0) {
    local_68 = 0;
  }
  params_7_00 = (ArrayPtr<const_char> *)0x1ff945;
  local_80.size_ = strlen((char *)params_6);
  local_80.ptr = (char *)params_6;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_90,&local_a0,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)(local_a2 + 1),(FixedArray<char,_1UL> *)&local_60,
             (CappedArray<char,_14UL> *)local_a2,(FixedArray<char,_1UL> *)&local_70,&local_80,
             params_7_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}